

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusArcIntersect.cpp
# Opt level: O1

int GeoCalcs::AdjustIntersects(int nIntersects,Locus *locus,LLPoint *intPt1,LLPoint *intPt2)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  PtIsOnGeodesicResult ptResult1;
  PtIsOnGeodesicResult ptResult2;
  PtIsOnGeodesicResult local_a8;
  PtIsOnGeodesicResult local_68;
  
  if (nIntersects == 2) {
    local_a8.geoPt.latitude = 0.0;
    local_a8.geoPt.longitude = 0.0;
    local_a8.geoEnd.latitude = 0.0;
    local_a8.geoEnd.longitude = 0.0;
    local_a8.geoStart.latitude = 0.0;
    local_a8.geoStart.longitude = 0.0;
    local_a8.lengthCode = 0;
    local_a8.result = 0;
    local_68.lengthCode = 0;
    local_68.result = 0;
    local_68.geoPt.latitude = 0.0;
    local_68.geoPt.longitude = 0.0;
    local_68.geoEnd.latitude = 0.0;
    local_68.geoEnd.longitude = 0.0;
    local_68.geoStart.latitude = 0.0;
    local_68.geoStart.longitude = 0.0;
    bVar2 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt1,0,&local_a8);
    bVar3 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt2,0,&local_68);
    if (!bVar2 && !bVar3) {
      return 0;
    }
    if (!bVar3 && bVar2) {
      return (uint)(local_a8.result != 0);
    }
    if (bVar2) {
      if (local_68.result == 0 || local_a8.result != 0) {
        return (local_a8.result == 0 || local_68.result != 0) + 1;
      }
      uVar4 = *(undefined4 *)&intPt2->latitude;
      uVar5 = *(undefined4 *)((long)&intPt2->latitude + 4);
      uVar6 = *(undefined4 *)&intPt2->longitude;
      uVar7 = *(undefined4 *)((long)&intPt2->longitude + 4);
    }
    else {
      if (local_68.result == 0) {
        return 0;
      }
      uVar4 = *(undefined4 *)&intPt2->latitude;
      uVar5 = *(undefined4 *)((long)&intPt2->latitude + 4);
      uVar6 = *(undefined4 *)&intPt2->longitude;
      uVar7 = *(undefined4 *)((long)&intPt2->longitude + 4);
    }
    *(undefined4 *)&intPt1->latitude = uVar4;
    *(undefined4 *)((long)&intPt1->latitude + 4) = uVar5;
    *(undefined4 *)&intPt1->longitude = uVar6;
    *(undefined4 *)((long)&intPt1->longitude + 4) = uVar7;
  }
  else {
    if (nIntersects != 1) {
      return nIntersects;
    }
    local_a8.geoPt.latitude = 0.0;
    local_a8.geoPt.longitude = 0.0;
    local_a8.geoEnd.latitude = 0.0;
    local_a8.geoEnd.longitude = 0.0;
    local_a8.geoStart.latitude = 0.0;
    local_a8.geoStart.longitude = 0.0;
    local_a8.lengthCode = 0;
    local_a8.result = 0;
    local_68.lengthCode = 0;
    local_68.result = 0;
    local_68.geoPt.latitude = 0.0;
    local_68.geoPt.longitude = 0.0;
    local_68.geoEnd.latitude = 0.0;
    local_68.geoEnd.longitude = 0.0;
    local_68.geoStart.latitude = 0.0;
    local_68.geoStart.longitude = 0.0;
    bVar2 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt1,0,&local_a8);
    bVar3 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt2,0,&local_68);
    if (bVar2 && bVar3) {
      if (local_a8.result != 0) {
        return 1;
      }
      dVar1 = intPt2->longitude;
      intPt1->latitude = intPt2->latitude;
      intPt1->longitude = dVar1;
      return 1;
    }
    if (!bVar3 || local_68.result == 0) {
      return (uint)(!bVar2 || local_a8.result != 0);
    }
    dVar1 = intPt2->longitude;
    intPt1->latitude = intPt2->latitude;
    intPt1->longitude = dVar1;
  }
  return 1;
}

Assistant:

int AdjustIntersects(int nIntersects, const Locus &locus, LLPoint &intPt1, LLPoint &intPt2)
    {
        switch (nIntersects)
        {
            case 0:
                return 0;
            case 1:
            {
                PtIsOnGeodesicResult ptResult1, ptResult2;
                const bool bVal1 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt1, 0, ptResult1);
                const bool bVal2 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt2, 0, ptResult2);
                if (bVal1 && bVal2)
                {
                    if (!ptResult1.result)
                    {
                        intPt1 = intPt2;
                    }
                }
                else if (bVal2 && ptResult2.result)
                {
                    intPt1 = intPt2;
                }
                else if (bVal1 && !ptResult1.result)
                {
                    nIntersects--;
                }
                break;
            }
            case 2:
            {
                PtIsOnGeodesicResult ptResult1, ptResult2;
                const bool bVal1 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt1, 0, ptResult1);
                const bool bVal2 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt2, 0, ptResult2);
                if (!bVal1 && !bVal2)
                    nIntersects = 0;
                else if (bVal1 && !bVal2)
                {
                    nIntersects = 1;
                    if (!ptResult1.result)
                        nIntersects = 0;
                }
                else if (!bVal1) // && bVal2)
                {
                    nIntersects = 1;
                    if (!ptResult2.result)
                        nIntersects = 0;
                    else
                    {
                        intPt1 = intPt2;
                    }
                }
                else
                {
                    if (!ptResult1.result && ptResult2.result)
                    {
                        nIntersects = 1;
                        intPt1 = intPt2;
                    }
                    else if (ptResult1.result && !ptResult2.result)
                    {
                        nIntersects = 1;
                    }
                }
                break;
            }
            default:
                break;
        }
        return nIntersects;
    }